

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O1

void RigidBodyDynamics::Utils::CalcCenterOfMass
               (Model *model,VectorNd *q,VectorNd *qdot,double *mass,Vector3d *com,
               Vector3d *com_velocity,Vector3d *angular_momentum,bool update_kinematics)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  pointer pSVar6;
  pointer pSVar7;
  pointer pSVar8;
  pointer pSVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  SpatialVector htot;
  double local_218;
  double local_208;
  SpatialVector local_1f8;
  undefined1 local_1c8 [24];
  double *local_1b0;
  Vector3d *local_1a8;
  Vector3d *local_1a0;
  long local_198;
  long local_190;
  SpatialTransform local_188 [3];
  SpatialVector local_68;
  
  local_1b0 = mass;
  local_1a8 = com_velocity;
  local_1a0 = com;
  if (update_kinematics) {
    UpdateKinematicsCustom(model,q,qdot,(VectorNd *)0x0);
  }
  uVar24 = ((long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  if (1 < uVar24) {
    uVar28 = 1;
    lVar29 = 0x50;
    lVar25 = 0x30;
    do {
      pSVar6 = (model->I).
               super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar7 = (model->Ic).
               super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&(pSVar7->h).super_Vector3d + lVar29 + -8) =
           *(undefined8 *)((long)&(pSVar6->h).super_Vector3d + lVar29 + -8);
      puVar1 = (undefined8 *)((long)&(pSVar6->h).super_Vector3d + lVar29);
      uVar19 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pSVar7->h).super_Vector3d + lVar29);
      *puVar2 = *puVar1;
      puVar2[1] = uVar19;
      *(undefined8 *)((long)&(pSVar7->h).super_Vector3d + lVar29 + 0x10U) =
           *(undefined8 *)((long)&(pSVar6->h).super_Vector3d + lVar29 + 0x10U);
      puVar1 = (undefined8 *)((long)(&pSVar6->h + 1) + lVar29);
      uVar19 = puVar1[1];
      puVar2 = (undefined8 *)((long)(&pSVar6->h + 1) + 0x10U + lVar29);
      uVar20 = *puVar2;
      uVar21 = puVar2[1];
      puVar2 = (undefined8 *)((long)(&pSVar6->h + 2) + 8U + lVar29);
      uVar22 = *puVar2;
      uVar23 = puVar2[1];
      puVar2 = (undefined8 *)((long)(&pSVar7->h + 1) + lVar29);
      *puVar2 = *puVar1;
      puVar2[1] = uVar19;
      puVar1 = (undefined8 *)((long)(&pSVar7->h + 1) + 0x10U + lVar29);
      *puVar1 = uVar20;
      puVar1[1] = uVar21;
      puVar1 = (undefined8 *)((long)(&pSVar7->h + 2) + 8U + lVar29);
      *puVar1 = uVar22;
      puVar1[1] = uVar23;
      Math::SpatialRigidBodyInertia::toMatrix
                ((SpatialRigidBodyInertia *)
                 ((long)&(((model->Ic).
                           super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           ._M_impl.super__Vector_impl_data._M_start)->h).super_Vector3d +
                 lVar29 + -8));
      local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
           (double)((long)&(((model->v).
                             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             .
                             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar25);
      local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
           (double)local_188;
      SpatialVector_t::operator=
                ((SpatialVector_t *)
                 ((long)&(((model->hc).
                           super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           .
                           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar25),
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)&local_1f8);
      uVar28 = uVar28 + 1;
      uVar24 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      lVar29 = lVar29 + 0x50;
      lVar25 = lVar25 + 0x30;
    } while (uVar28 < uVar24);
  }
  local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._0_16_ =
       ZEXT816(0);
  local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
  local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
  local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  lVar25 = uVar24 - 1;
  if (lVar25 == 0) {
    local_218 = 0.0;
    local_208 = 0.0;
    auVar31 = (undefined1  [16])
              local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array.
              _0_16_;
  }
  else {
    local_208 = 0.0;
    local_218 = 0.0;
    local_1c8._0_16_ =
         (undefined1  [16])
         local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._0_16_;
    lVar29 = uVar24 * 0x50;
    lVar27 = uVar24 * 0x30;
    lVar30 = uVar24 * 0x60;
    do {
      lVar26 = lVar27 + -0x30;
      uVar24 = (ulong)(model->lambda).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar25];
      if (uVar24 == 0) {
        Math::SpatialTransform::applyTranspose
                  ((SpatialRigidBodyInertia *)local_188,
                   (SpatialTransform *)
                   ((long)&(model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d + lVar30),
                   (SpatialRigidBodyInertia *)
                   ((long)&(model->Ic).
                           super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].h.super_Vector3d +
                   lVar29 + -8));
        local_208 = local_208 +
                    local_188[0].E.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[0];
        local_1c8._8_8_ =
             (double)local_1c8._8_8_ +
             local_188[0].E.super_Matrix3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
        local_1c8._0_8_ =
             (double)local_1c8._0_8_ +
             local_188[0].E.super_Matrix3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
        local_218 = local_218 +
                    local_188[0].E.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[3];
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)&(model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d + lVar30),
                   (SpatialVector *)
                   ((long)&(model->hc).
                           super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           .
                           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].
                           super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar27));
        local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
             + local_188[0].E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [1];
        local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
             + local_188[0].E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [0];
        local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2]
             + local_188[0].E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [2];
        local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
             local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]
             + local_188[0].E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [3];
        local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
             local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]
             + local_188[0].E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [4];
        local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
             local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5]
             + local_188[0].E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [5];
      }
      else {
        pSVar6 = (model->Ic).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_198 = lVar26;
        local_190 = lVar25;
        Math::SpatialTransform::applyTranspose
                  ((SpatialRigidBodyInertia *)local_188,
                   (SpatialTransform *)
                   ((long)&(model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d + lVar30),
                   (SpatialRigidBodyInertia *)((long)&pSVar6[-1].h.super_Vector3d + lVar29 + -8));
        lVar26 = local_198;
        dVar11 = *(double *)&pSVar6[uVar24].h.super_Vector3d;
        dVar12 = *(double *)((long)&pSVar6[uVar24].h.super_Vector3d + 8);
        dVar5 = pSVar6[uVar24].Izz;
        pSVar7 = (model->Ic).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar3 = (double *)((long)&pSVar6[uVar24].h.super_Vector3d + 0x10);
        dVar13 = *pdVar3;
        dVar14 = pdVar3[1];
        pSVar7[uVar24].m =
             pSVar6[uVar24].m +
             local_188[0].E.super_Matrix3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
        dVar15 = pSVar6[uVar24].Iyx;
        dVar16 = (&pSVar6[uVar24].Iyx)[1];
        dVar17 = pSVar6[uVar24].Izx;
        dVar18 = (&pSVar6[uVar24].Izx)[1];
        *(double *)&pSVar7[uVar24].h.super_Vector3d =
             local_188[0].E.super_Matrix3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
             + dVar11;
        *(double *)((long)&pSVar7[uVar24].h.super_Vector3d + 8) =
             local_188[0].E.super_Matrix3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
             + dVar12;
        pdVar3 = (double *)((long)&pSVar7[uVar24].h.super_Vector3d + 0x10);
        *pdVar3 = dVar13 + local_188[0].E.super_Matrix3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array[3];
        pdVar3[1] = dVar14 + local_188[0].E.super_Matrix3d.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array[4];
        pSVar7[uVar24].Iyx =
             local_188[0].E.super_Matrix3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
             + dVar15;
        (&pSVar7[uVar24].Iyx)[1] =
             local_188[0].E.super_Matrix3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
             + dVar16;
        pSVar7[uVar24].Izx =
             local_188[0].E.super_Matrix3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
             + dVar17;
        (&pSVar7[uVar24].Izx)[1] =
             local_188[0].E.super_Matrix3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
             + dVar18;
        pSVar7[uVar24].Izz =
             dVar5 + local_188[0].r.super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[0];
        pSVar8 = (model->hc).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)&(model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d + lVar30),
                   (SpatialVector *)
                   ((long)&(pSVar8->super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + local_198)
                  );
        pSVar9 = (model->hc).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar5 = *(double *)
                 ((long)&pSVar8[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        *(double *)
         &pSVar9[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
             *(double *)
              &pSVar8[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
             local_188[0].E.super_Matrix3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
        *(double *)
         ((long)&pSVar9[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
             dVar5 + local_188[0].E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[1];
        pdVar3 = (double *)
                 ((long)&pSVar8[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar5 = pdVar3[1];
        pdVar4 = (double *)
                 ((long)&pSVar9[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar4 = *pdVar3 + local_188[0].E.super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[2];
        pdVar4[1] = dVar5 + local_188[0].E.super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[3];
        pdVar3 = (double *)
                 ((long)&pSVar8[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar5 = pdVar3[1];
        pdVar4 = (double *)
                 ((long)&pSVar9[uVar24].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar4 = *pdVar3 + local_188[0].E.super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[4];
        pdVar4[1] = dVar5 + local_188[0].E.super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[5];
        lVar25 = local_190;
      }
      lVar25 = lVar25 + -1;
      auVar31 = local_1c8._0_16_;
      lVar29 = lVar29 + -0x50;
      lVar27 = lVar26;
      lVar30 = lVar30 + -0x60;
    } while (lVar25 != 0);
  }
  *local_1b0 = local_208;
  auVar10._8_8_ = local_208;
  auVar10._0_8_ = local_208;
  auVar31 = divpd(auVar31,auVar10);
  *(undefined1 (*) [16])
   (local_1a0->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
   m_storage.m_data.array = auVar31;
  (local_1a0->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
  .m_data.array[2] = local_218 / local_208;
  if (local_1a8 != (Vector3d *)0x0) {
    dVar5 = *local_1b0;
    auVar31._8_8_ =
         local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    auVar31._0_8_ =
         local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    auVar32._8_8_ = dVar5;
    auVar32._0_8_ = dVar5;
    auVar31 = divpd(auVar31,auVar32);
    *(undefined1 (*) [16])
     (local_1a8->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
     m_storage.m_data.array = auVar31;
    (local_1a8->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] =
         local_1f8.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] /
         dVar5;
  }
  if (angular_momentum != (Vector3d *)0x0) {
    local_188[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] = 0.0;
    local_188[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = 0.0;
    local_188[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = 0.0;
    local_188[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[5] = 0.0;
    local_188[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[6] = 0.0;
    local_188[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[7] = 0.0;
    local_188[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = 1.0;
    local_188[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] = 1.0;
    local_188[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[8] = 1.0;
    local_188[0].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] =
         (local_1a0->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[0];
    local_188[0].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] =
         (local_1a0->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[1];
    local_188[0].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] =
         (local_1a0->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    Math::SpatialTransform::applyAdjoint(&local_68,local_188,&local_1f8);
    (angular_momentum->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] =
         local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    (angular_momentum->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] =
         local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    (angular_momentum->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] =
         local_68.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  }
  return;
}

Assistant:

RBDL_DLLAPI void CalcCenterOfMass (Model &model, const Math::VectorNd &q, const Math::VectorNd &qdot, double &mass, Math::Vector3d &com, Math::Vector3d *com_velocity, Vector3d *angular_momentum, bool update_kinematics) {
	if (update_kinematics)
		UpdateKinematicsCustom (model, &q, &qdot, NULL);

	for (size_t i = 1; i < model.mBodies.size(); i++) {
		model.Ic[i] = model.I[i];
		model.hc[i] = model.Ic[i].toMatrix() * model.v[i];
	}

	SpatialRigidBodyInertia Itot (0., Vector3d (0., 0., 0.), Matrix3d::Zero(3,3));
	SpatialVector htot (SpatialVector::Zero(6));

	for (size_t i = model.mBodies.size() - 1; i > 0; i--) {
		unsigned int lambda = model.lambda[i];

		if (lambda != 0) {
			model.Ic[lambda] = model.Ic[lambda] + model.X_lambda[i].applyTranspose (model.Ic[i]);
			model.hc[lambda] = model.hc[lambda] + model.X_lambda[i].applyTranspose (model.hc[i]);
		} else {
			Itot = Itot + model.X_lambda[i].applyTranspose (model.Ic[i]);
			htot = htot + model.X_lambda[i].applyTranspose (model.hc[i]);
		}
	}

	mass = Itot.m;
	com = Itot.h / mass;
	LOG << "mass = " << mass << " com = " << com.transpose() << " htot = " << htot.transpose() << std::endl;

	if (com_velocity) 
		*com_velocity = Vector3d (htot[3] / mass, htot[4] / mass, htot[5] / mass);

	if (angular_momentum) {
		htot = Xtrans (com).applyAdjoint (htot);
		angular_momentum->set (htot[0], htot[1], htot[2]);
	}
}